

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O1

size_t DepParserTask::transition_hybrid
                 (search *sch,uint64_t a_id,uint32_t idx,uint32_t t_id,uint32_t param_5)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  ulong uVar5;
  vw_exception *this;
  ulong uVar6;
  float loss;
  stringstream __msg;
  uint32_t local_1c4;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190;
  
  pvVar4 = sch->task_data;
  local_1c4 = idx;
  if (a_id == 3) {
    uVar2 = *(uint *)(*(long *)((long)pvVar4 + 0xa0) + -4);
    uVar5 = (ulong)uVar2;
    *(uint32_t *)(*(long *)((long)pvVar4 + 0xb8) + uVar5 * 4) = idx;
    uVar6 = (ulong)idx;
    *(undefined4 *)(*(long *)((long)pvVar4 + 0x1f8) + uVar6 * 4) =
         *(undefined4 *)(*(long *)((long)pvVar4 + 0x1d8) + uVar6 * 4);
    *(uint *)(*(long *)((long)pvVar4 + 0x1d8) + uVar6 * 4) = uVar2;
    piVar1 = (int *)(*(long *)((long)pvVar4 + 0x198) + uVar6 * 4);
    *piVar1 = *piVar1 + 1;
  }
  else {
    if (a_id != 2) {
      if (a_id != 1) {
        std::__cxx11::stringstream::stringstream(local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&local_190,"transition_hybrid failed",0x18);
        this = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (this,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/search_dep_parser.cc"
                   ,0xc1,&local_1c0);
        __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      v_array<unsigned_int>::push_back((v_array<unsigned_int> *)((long)pvVar4 + 0x98),&local_1c4);
      local_1c4 = local_1c4 + 1;
      goto LAB_0026dacf;
    }
    uVar2 = *(uint *)(*(long *)((long)pvVar4 + 0xa0) + -8);
    uVar6 = (ulong)uVar2;
    uVar3 = *(uint *)(*(long *)((long)pvVar4 + 0xa0) + -4);
    uVar5 = (ulong)uVar3;
    *(uint *)(*(long *)((long)pvVar4 + 0xb8) + uVar5 * 4) = uVar2;
    *(undefined4 *)(*(long *)((long)pvVar4 + 0x238) + uVar6 * 4) =
         *(undefined4 *)(*(long *)((long)pvVar4 + 0x218) + uVar6 * 4);
    *(uint *)(*(long *)((long)pvVar4 + 0x218) + uVar6 * 4) = uVar3;
    piVar1 = (int *)(*(long *)((long)pvVar4 + 0x1b8) + uVar6 * 4);
    *piVar1 = *piVar1 + 1;
  }
  *(uint32_t *)(*(long *)((long)pvVar4 + 0xd8) + uVar5 * 4) = t_id;
  if (*(int *)(*(long *)((long)pvVar4 + 0x58) + uVar5 * 4) ==
      *(int *)(*(long *)((long)pvVar4 + 0xb8) + uVar5 * 4)) {
    loss = 0.0;
    if (*(uint32_t *)(*(long *)((long)pvVar4 + 0x78) + uVar5 * 4) != t_id) {
      loss = 1.0;
    }
  }
  else {
    loss = 2.0;
  }
  Search::search::loss(sch,loss);
  *(long *)((long)pvVar4 + 0xa0) = *(long *)((long)pvVar4 + 0xa0) + -4;
LAB_0026dacf:
  return (ulong)local_1c4;
}

Assistant:

size_t transition_hybrid(Search::search &sch, uint64_t a_id, uint32_t idx, uint32_t t_id, uint32_t /* n */)
{
  task_data *data = sch.get_task_data<task_data>();
  v_array<uint32_t> &heads = data->heads, &stack = data->stack, &gold_heads = data->gold_heads,
                    &gold_tags = data->gold_tags, &tags = data->tags;
  v_array<uint32_t> *children = data->children;
  if (a_id == SHIFT)
  {
    stack.push_back(idx);
    return idx + 1;
  }
  else if (a_id == REDUCE_RIGHT)
  {
    uint32_t last = stack.last();
    uint32_t hd = stack[stack.size() - 2];
    heads[last] = hd;
    children[5][hd] = children[4][hd];
    children[4][hd] = last;
    children[1][hd]++;
    tags[last] = t_id;
    sch.loss(gold_heads[last] != heads[last] ? 2 : (gold_tags[last] != t_id) ? 1.f : 0.f);
    assert(!stack.empty());
    stack.pop();
    return idx;
  }
  else if (a_id == REDUCE_LEFT)
  {
    size_t last = stack.last();
    uint32_t hd = idx;
    heads[last] = hd;
    children[3][hd] = children[2][hd];
    children[2][hd] = (uint32_t)last;
    children[0][hd]++;
    tags[last] = t_id;
    sch.loss(gold_heads[last] != heads[last] ? 2 : (gold_tags[last] != t_id) ? 1.f : 0.f);
    assert(!stack.empty());
    stack.pop();
    return idx;
  }
  THROW("transition_hybrid failed");
}